

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_select(Curl_easy *data)

{
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  char *pcVar3;
  char *mailbox;
  imap_conn *imapc;
  IMAP *imap;
  connectdata *conn;
  CURLcode result;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  pFVar2 = (data->req).p.file;
  (*Curl_cfree)((pcVar1->proto).imapc.mailbox);
  (pcVar1->proto).ftpc.retr_size_saved = 0;
  (*Curl_cfree)((pcVar1->proto).ftpc.server_os);
  (pcVar1->proto).ftpc.server_os = (char *)0x0;
  if (pFVar2->freepath == (char *)0x0) {
    Curl_failf(data,"Cannot SELECT without a mailbox.");
    data_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    pcVar3 = imap_atom(pFVar2->freepath,false);
    if (pcVar3 == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      data_local._4_4_ = imap_sendf(data,"SELECT %s",pcVar3);
      (*Curl_cfree)(pcVar3);
      if (data_local._4_4_ == CURLE_OK) {
        imap_state(data,IMAP_SELECT);
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_perform_select(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct IMAP *imap = data->req.p.imap;
  struct imap_conn *imapc = &conn->proto.imapc;
  char *mailbox;

  /* Invalidate old information as we are switching mailboxes */
  Curl_safefree(imapc->mailbox);
  Curl_safefree(imapc->mailbox_uidvalidity);

  /* Check we have a mailbox */
  if(!imap->mailbox) {
    failf(data, "Cannot SELECT without a mailbox.");
    return CURLE_URL_MALFORMAT;
  }

  /* Make sure the mailbox is in the correct atom format */
  mailbox = imap_atom(imap->mailbox, FALSE);
  if(!mailbox)
    return CURLE_OUT_OF_MEMORY;

  /* Send the SELECT command */
  result = imap_sendf(data, "SELECT %s", mailbox);

  free(mailbox);

  if(!result)
    imap_state(data, IMAP_SELECT);

  return result;
}